

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O0

void __thiscall
geometrycentral::
DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Edge,_double>_>::
DependentQuantityD(DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Edge,_double>_>
                   *this,MeshData<geometrycentral::surface::Edge,_double> *dataBuffer_,
                  function<void_()> *evaluateFunc_,
                  vector<geometrycentral::DependentQuantity_*,_std::allocator<geometrycentral::DependentQuantity_*>_>
                  *listToJoin)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  function<void_()> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  DependentQuantity *in_stack_ffffffffffffffd0;
  
  std::function<void_()>::function
            (in_stack_ffffffffffffffb0,(function<void_()> *)&stack0xffffffffffffffc0);
  DependentQuantity::DependentQuantity
            (in_stack_ffffffffffffffd0,(function<void_()> *)in_stack_ffffffffffffffc8,
             (vector<geometrycentral::DependentQuantity_*,_std::allocator<geometrycentral::DependentQuantity_*>_>
              *)in_stack_ffffffffffffffc0);
  std::function<void_()>::~function((function<void_()> *)0x2a687c);
  *in_RDI = &PTR__DependentQuantityD_00793880;
  in_RDI[7] = in_RSI;
  return;
}

Assistant:

DependentQuantityD(D* dataBuffer_, std::function<void()> evaluateFunc_, std::vector<DependentQuantity*>& listToJoin)
      : DependentQuantity(evaluateFunc_, listToJoin), dataBuffer(dataBuffer_) {}